

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_opc_special_tx79(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  uint rs;
  uint rt;
  uint opc;
  
  uVar1 = (uint)(env->active_tc).gpr[7];
  opc = uVar1 & 0xfc00003f;
  if (opc - 8 < 0x18) {
    rs = uVar1 >> 0x15 & 0x1f;
    rt = uVar1 >> 0x10 & 0x1f;
    uVar1 = uVar1 >> 0xb & 0x1f;
    switch(opc) {
    case 8:
      gen_compute_branch((DisasContext_conflict6 *)env,8,4,rs,0,0,4);
      return;
    default:
      goto switchD_009a2c53_caseD_9;
    case 10:
    case 0xb:
      gen_cond_move(*(DisasContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8),opc,uVar1,rs,rt
                   );
      return;
    case 0x10:
    case 0x12:
      break;
    case 0x11:
    case 0x13:
      uVar1 = rs;
      break;
    case 0x18:
    case 0x19:
      gen_mul_txx9((DisasContext_conflict6 *)env,opc,uVar1,rs,rt);
      return;
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
      if ((*(byte *)((long)(env->active_tc).gpr + 0x46) & 8) != 0) {
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
    case 0x1a:
    case 0x1b:
      gen_muldiv((DisasContext_conflict6 *)env,opc,0,rs,rt);
      return;
    }
    gen_HILO((DisasContext_conflict6 *)env,opc,0,uVar1);
    return;
  }
switchD_009a2c53_caseD_9:
  generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
  return;
}

Assistant:

static void decode_opc_special_tx79(CPUMIPSState *env, DisasContext *ctx)
{
    int rs = extract32(ctx->opcode, 21, 5);
    int rt = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);
    uint32_t op1 = MASK_SPECIAL(ctx->opcode);

    switch (op1) {
    case OPC_MOVN:         /* Conditional move */
    case OPC_MOVZ:
        gen_cond_move(ctx, op1, rd, rs, rt);
        break;
    case OPC_MFHI:          /* Move from HI/LO */
    case OPC_MFLO:
        gen_HILO(ctx, op1, 0, rd);
        break;
    case OPC_MTHI:
    case OPC_MTLO:          /* Move to HI/LO */
        gen_HILO(ctx, op1, 0, rs);
        break;
    case OPC_MULT:
    case OPC_MULTU:
        gen_mul_txx9(ctx, op1, rd, rs, rt);
        break;
    case OPC_DIV:
    case OPC_DIVU:
        gen_muldiv(ctx, op1, 0, rs, rt);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMULT:
    case OPC_DMULTU:
    case OPC_DDIV:
    case OPC_DDIVU:
        check_insn_opc_user_only(ctx, INSN_R5900);
        gen_muldiv(ctx, op1, 0, rs, rt);
        break;
#endif
    case OPC_JR:
        gen_compute_branch(ctx, op1, 4, rs, 0, 0, 4);
        break;
    default:            /* Invalid */
        MIPS_INVAL("special_tx79");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}